

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O0

string * __thiscall
tcu::TestHierarchyIterator::buildNodePath_abi_cxx11_
          (string *__return_storage_ptr__,TestHierarchyIterator *this,
          vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
          *nodeStack)

{
  NodeIter *pNVar1;
  const_reference pvVar2;
  char *pcVar3;
  NodeIter *iter;
  size_t ndx;
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  *nodeStack_local;
  string *nodePath;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (iter = (NodeIter *)0x1;
      pNVar1 = (NodeIter *)
               std::
               vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
               ::size((vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
                       *)this), iter < pNVar1; iter = (NodeIter *)((long)&iter->node + 1)) {
    pvVar2 = std::
             vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
             ::operator[]((vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
                           *)this,(size_type)iter);
    if ((NodeIter *)0x1 < iter) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
    }
    pcVar3 = TestNode::getName(pvVar2->node);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestHierarchyIterator::buildNodePath (const vector<NodeIter>& nodeStack)
{
	string nodePath;
	for (size_t ndx = 1; ndx < nodeStack.size(); ndx++)
	{
		const NodeIter& iter = nodeStack[ndx];
		if (ndx > 1) // ignore root package
			nodePath += ".";
		nodePath += iter.node->getName();
	}
	return nodePath;
}